

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O3

void __thiscall
LongReadsMapper::map_reads
          (LongReadsMapper *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *readIDs)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  pointer pLVar4;
  pointer puVar5;
  void *pvVar6;
  pointer pvVar7;
  SatKmerIndex *this_00;
  NKmerIndex *this_01;
  const_iterator cVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ostream *poVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  size_type __n;
  LongReadsMapper *this_02;
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *pvVar16;
  ulong uVar17;
  char *s;
  int iVar18;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *threadm;
  vector<LongReadMapping,std::allocator<LongReadMapping>> *pvVar19;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> blocks;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  thread_mappings;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  shared_ptr<SatKmerIndex> skindex;
  shared_ptr<NKmerIndex> nkindex;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  ReadSequenceBuffer sequenceGetter;
  StreamKmerFactory skf;
  bool local_391;
  key_type_conflict3 local_390;
  allocator_type local_389;
  undefined1 local_388 [8];
  SequenceDistanceGraph *pSStack_380;
  pointer local_378;
  long local_368;
  LongReadsDatastore *local_360;
  pointer local_358;
  undefined1 local_350 [16];
  pointer local_340;
  _Bit_pointer local_330;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  local_328;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_308;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_300;
  __shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_2c8;
  vector<LongReadMapping,std::allocator<LongReadMapping>> *local_2a8;
  LongReadsMapper local_2a0;
  undefined1 local_1cf;
  undefined1 local_1cd;
  undefined1 local_1c9;
  undefined1 local_1bc;
  undefined8 local_138;
  char local_130 [65];
  undefined1 local_ef;
  undefined1 local_ed;
  undefined1 local_e9;
  undefined1 local_dc;
  undefined1 local_cf;
  undefined1 local_cd;
  undefined1 local_c9;
  undefined1 local_bc;
  undefined8 local_38;
  
  pLVar4 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl
      .super__Vector_impl_data._M_finish != pLVar4) {
    (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar4;
  }
  local_2d8._M_ptr = (NKmerIndex *)0x0;
  local_2d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2e8._M_ptr = (SatKmerIndex *)0x0;
  local_2e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_308 = readIDs;
  if (this->sat_kmer_index == true) {
    this_00 = (SatKmerIndex *)operator_new(0x38);
    SatKmerIndex::SatKmerIndex(this_00,this->sg,this->k,(uint8_t)this->max_index_freq);
    std::__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<SatKmerIndex>
              (&local_2e8,this_00);
  }
  else {
    this_01 = (NKmerIndex *)operator_new(0x50);
    NKmerIndex::NKmerIndex(this_01,this->sg,this->k,this->max_index_freq);
    std::__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<NKmerIndex>(&local_2d8,this_01)
    ;
  }
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((long)local_328.
                       super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x18);
  *(undefined8 *)
   ((long)local_328.
          super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x10) = 0;
  *(undefined8 *)
   local_328.
   super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined8 *)
   ((long)local_328.
          super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 8) = 0;
  local_2a0.mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = this->k;
  local_2a0.all_paths_between._M_h._M_buckets =
       (__buckets_ptr)
       ~(-1L << ((byte)((uint)(byte)local_2a0.mappings.
                                    super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 2) & 0x3f))
  ;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0.all_paths_between._M_h._M_bucket_count =
       (ulong)((uint)(byte)local_2a0.mappings.
                           super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * 2) - 2;
  local_138 = 0;
  local_38 = 0;
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_328.
       super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2a8 = (vector<LongReadMapping,std::allocator<LongReadMapping>> *)
              local_328.
              super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  memset(&local_2a0.all_paths_between._M_h._M_before_begin,4,0xff);
  memset(local_130,4,0xff);
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
  local_1cf = 0;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._3_1_ = 1;
  local_1cd = 1;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = 2;
  local_1c9 = 2;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 3;
  local_1bc = 3;
  local_ef = 3;
  local_cf = 3;
  local_ed = 2;
  local_cd = 2;
  local_e9 = 1;
  local_c9 = 1;
  local_dc = 0;
  local_bc = 0;
  local_378 = (pointer)0x0;
  local_388 = (undefined1  [8])0x0;
  pSStack_380 = (SequenceDistanceGraph *)0x0;
  ReadSequenceBuffer::ReadSequenceBuffer
            ((ReadSequenceBuffer *)&local_2a0,this->datastore,0x1e00000,0x400000);
  local_2c8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_300,
             ((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x2492492492492492,
             (allocator_type *)local_350);
  local_390 = 1;
  iVar18 = 0;
  if ((long)(this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    local_368 = 0;
    local_360 = (LongReadsDatastore *)0x0;
    local_358 = (pointer)0x0;
  }
  else {
    local_358 = (pointer)0x0;
    local_360 = (LongReadsDatastore *)0x0;
    local_368 = 0;
    do {
      iVar18 = iVar18 + 1;
      if (((uint)(iVar18 * 0x3afb7e91) >> 4 | iVar18 * 0x10000000) < 0x68db9) {
        poVar12 = sdglib::OutputLog(INFO,true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Thread #",8);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," processing its read #",0x16);
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
      if (*(long *)(local_308 + 0x18) == 0) {
LAB_001a1d97:
        if ((uint)(this->min_size * 2) <=
            (this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_start[local_390].record_size) {
          this_02 = &local_2a0;
          pbVar9 = (byte *)ReadSequenceBuffer::get_read_sequence
                                     ((ReadSequenceBuffer *)this_02,(ulong)local_390);
          if ((undefined1  [8])pSStack_380 != local_388) {
            pSStack_380 = (SequenceDistanceGraph *)local_388;
          }
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while( true ) {
            bVar3 = *pbVar9;
            if ((bVar3 == 0) || (bVar3 == 10)) break;
            lVar13 = (long)*(char *)((long)&local_2a0.all_paths_between._M_h._M_before_begin._M_nxt
                                    + (ulong)bVar3);
            uVar10 = (long)local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * 4;
            if (lVar13 == 4) {
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((3L << ((byte)local_2a0.all_paths_between._M_h._M_bucket_count & 0x3f))
                            + ((ulong)local_2a0.first_mapping.
                                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_finish >> 2));
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
            }
            else {
              uVar10 = uVar10 + lVar13;
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)(((long)local_130[bVar3] <<
                             ((byte)local_2a0.all_paths_between._M_h._M_bucket_count & 0x3f)) +
                            ((ulong)local_2a0.first_mapping.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_finish >> 2));
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)local_2a0.first_mapping.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start + 1);
            }
            local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(uVar10 & (ulong)local_2a0.all_paths_between._M_h._M_buckets);
            if ((long)(ulong)(byte)local_2a0.mappings.
                                   super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage <=
                (long)local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
              if (local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage <
                  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_350[0] = (allocator_type)0x0;
                this_02 = (LongReadsMapper *)local_388;
                std::
                vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                ::emplace_back<bool,unsigned_long&>
                          ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                            *)this_02,(bool *)local_350,
                           (unsigned_long *)
                           &local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                local_350[0] = (allocator_type)0x1;
                this_02 = (LongReadsMapper *)local_388;
                std::
                vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                ::emplace_back<bool,unsigned_long&>
                          ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                            *)this_02,(bool *)local_350,
                           (unsigned_long *)
                           &local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
              }
            }
            pbVar9 = pbVar9 + 1;
          }
          __n = (long)pSStack_380 - (long)local_388 >> 4;
          if ((ulong)((long)this->min_size * 2) <= __n) {
            if (this->sat_kmer_index == true) {
              get_sat_kmer_matches
                        (this_02,local_2e8._M_ptr,&local_2c8,
                         (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          *)local_388);
            }
            else {
              local_391 = false;
              std::vector<bool,_std::allocator<bool>_>::vector
                        ((vector<bool,_std::allocator<bool>_> *)local_350,__n,&local_391,&local_389)
              ;
              if ((long)pSStack_380 - (long)local_388 != 0) {
                lVar13 = (long)pSStack_380 - (long)local_388 >> 4;
                uVar17 = (ulong)((local_2d8._M_ptr)->bfilter).dataSz;
                puVar5 = ((local_2d8._M_ptr)->bfilter).data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pvVar16 = &((DistanceGraph *)local_388)->links;
                uVar10 = 0;
                do {
                  uVar14 = (ulong)(pvVar16->
                                  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start %
                           ((local_2d8._M_ptr)->bfilter).estimated_size;
                  uVar15 = uVar10 + 0x3f;
                  if (-1 < (long)uVar10) {
                    uVar15 = uVar10;
                  }
                  uVar11 = 1L << ((byte)uVar10 & 0x3f);
                  lVar1 = CONCAT71(local_350._1_7_,local_350[0]) + ((long)uVar15 >> 6) * 8;
                  lVar2 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
                  if ((puVar5[uVar14 / uVar17] >> ((byte)(7 - (char)(uVar14 % uVar17)) & 0x1f) & 1)
                      == 0) {
                    uVar11 = ~uVar11 & *(ulong *)(lVar1 + lVar2);
                  }
                  else {
                    uVar11 = uVar11 | *(ulong *)(lVar1 + lVar2);
                  }
                  *(ulong *)(lVar1 + lVar2) = uVar11;
                  uVar10 = uVar10 + 1;
                  pvVar16 = (vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                             *)&(pvVar16->
                                super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_end_of_storage;
                } while (lVar13 + (ulong)(lVar13 == 0) != uVar10);
              }
              get_all_kmer_matches
                        (this,local_2d8._M_ptr,&local_2c8,
                         (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          *)local_388,(vector<bool,_std::allocator<bool>_> *)local_350);
              pvVar6 = (void *)CONCAT71(local_350._1_7_,local_350[0]);
              if (pvVar6 != (void *)0x0) {
                operator_delete(pvVar6,(long)local_330 - (long)pvVar6);
              }
            }
            count_candidates(this,&local_300,&local_2c8,
                             (uint32_t)((ulong)((long)pSStack_380 - (long)local_388) >> 4));
            alignment_blocks((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)local_350,
                             this,local_390,&local_2c8,
                             (uint32_t)((ulong)((long)pSStack_380 - (long)local_388) >> 4),
                             &local_300);
            memset(local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,0,
                   (long)local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            if ((pointer)CONCAT71(local_350._1_7_,local_350[0]) == (pointer)local_350._8_8_) {
              local_358 = (pointer)((long)&local_358->node + 1);
            }
            else if (local_350._8_8_ - (long)CONCAT71(local_350._1_7_,local_350[0]) == 0x20) {
              local_360 = (LongReadsDatastore *)((long)&local_360->ws + 1);
            }
            else {
              local_368 = local_368 + 1;
            }
            std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<LongReadMapping_const*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>>
                      (local_2a8,*(undefined8 *)(local_2a8 + 8));
            pvVar6 = (void *)CONCAT71(local_350._1_7_,local_350[0]);
            if (pvVar6 != (void *)0x0) {
              operator_delete(pvVar6,(long)local_340 - (long)pvVar6);
            }
          }
        }
      }
      else {
        cVar8 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_308,&local_390);
        if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
        goto LAB_001a1d97;
      }
      local_390 = local_390 + 1;
    } while ((ulong)local_390 <=
             ((long)(this->datastore->read_to_fileRecord).
                    super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->datastore->read_to_fileRecord).
                    super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4) - 1U);
  }
  if (local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_300.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_300.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_2c8);
  ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)&local_2a0);
  if (local_388 != (undefined1  [8])0x0) {
    operator_delete((void *)local_388,(long)local_378 - (long)local_388);
  }
  poVar12 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Read results:    ",0x11);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," no match    ",0xd);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," single match    ",0x11);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," multi matches",0xe);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  pvVar7 = local_328.
           super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_328.
      super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_328.
      super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar19 = (vector<LongReadMapping,std::allocator<LongReadMapping>> *)
              local_328.
              super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>>
                ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)&this->mappings,
                 (this->mappings).
                 super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                 super__Vector_impl_data._M_finish,*(undefined8 *)pvVar19,
                 *(undefined8 *)(pvVar19 + 8));
      pvVar19 = pvVar19 + 0x18;
    } while (pvVar19 != (vector<LongReadMapping,std::allocator<LongReadMapping>> *)pvVar7);
  }
  poVar12 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Updating mapping indexes",0x18);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  update_indexes(this);
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::~vector(&local_328);
  if (local_2e8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e8._M_refcount._M_pi);
  }
  if (local_2d8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_refcount._M_pi);
  }
  return;
}

Assistant:

void LongReadsMapper::map_reads(const std::unordered_set<uint32_t> &readIDs) {
    mappings.clear();
    std::shared_ptr<NKmerIndex> nkindex;
    std::shared_ptr<SatKmerIndex> skindex;
    if (sat_kmer_index) skindex.reset(new SatKmerIndex(sg,k,max_index_freq));
    else nkindex.reset(new NKmerIndex(sg,k,max_index_freq));
    std::vector<std::vector<LongReadMapping>> thread_mappings(omp_get_max_threads());
    uint32_t num_reads_done(0);
    uint64_t no_matches(0),single_matches(0),multi_matches(0);
#pragma omp parallel
    {
        StreamKmerFactory skf(k);
        std::vector<std::pair<bool, uint64_t>> read_kmers;

        auto & private_results=thread_mappings[omp_get_thread_num()];
        ReadSequenceBuffer sequenceGetter(datastore);
        std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
        const char * query_sequence_ptr;

        std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);

#pragma omp for schedule(static,1000) reduction(+:no_matches,single_matches,multi_matches,num_reads_done)
        for (uint32_t readID = 1; readID <= datastore.size(); ++readID) {
            if (++num_reads_done%10000 == 0) {
                sdglib::OutputLog() << "Thread #"<<omp_get_thread_num() <<" processing its read #" << num_reads_done << std::endl;
            }

            if ((!readIDs.empty() and readIDs.count(readID)==0 /*Read not in selected set*/)) {
                continue;
            }
            if (datastore.read_to_fileRecord[readID].record_size< 2 * min_size ) continue;
            //========== 1. Get read sequence, kmerise, get all matches ==========
            query_sequence_ptr = sequenceGetter.get_read_sequence(readID);
            read_kmers.clear();
            skf.produce_all_kmers(query_sequence_ptr, read_kmers);

            if ( read_kmers.size()< 2 * min_size) {
                continue;
            }

            if (sat_kmer_index) {
                get_sat_kmer_matches(*skindex,node_matches, read_kmers);
            } else {
                std::vector<bool> kmer_in_assembly(read_kmers.size());

                for (uint64_t i = 0; i < read_kmers.size(); ++i) {
                    kmer_in_assembly[i] = nkindex->filter(read_kmers[i].second);
                }
                get_all_kmer_matches(*nkindex, node_matches, read_kmers, kmer_in_assembly);
            }

            //========== 2. Find match candidates in fixed windows ==========

            count_candidates(candidate_counts, node_matches,read_kmers.size());

            //========== 3. Create alignment blocks from candidates ==========

            auto blocks(alignment_blocks(readID,node_matches,read_kmers.size(), candidate_counts));
            std::memset(candidate_counts.data(), 0, candidate_counts.size());

            //========== 4. Construct mapping path ==========
            if (blocks.empty()) ++no_matches;
            else if (blocks.size()==1) ++single_matches;
            else ++multi_matches;
            //TODO: align blocks that occupy the same space as longer/better blocks should be thrown away.

            //auto fblocks=filter_blocks(blocks,node_matches,read_kmers.size());
            const auto &fblocks = blocks;

//            std::cout<<"READ " << readID << " mappings, after FILTERING:"<<std::endl;
//            for (auto b:fblocks)
//                std::cout << "READ\tTarget: " << b.node << " (" << sdg.nodes[llabs(b.node)].sequence.size() << " bp)  "
//                          << b.qStart << ":" << b.qEnd << " -> " << b.nStart << ":" << b.nEnd
//                          << " (" << b.score << " chained hits, " << b.qEnd - b.qStart + k << "bp, "
//                          << b.score * 100 / (b.qEnd - b.qStart) << "%)"
//                          << std::endl;

            private_results.insert(private_results.end(),fblocks.begin(),fblocks.end());
        }
    }
    //TODO: report read and win coverage by winners vs. by loosers
//    sdglib::OutputLog()<<"Read window results:    "<<window_low_score<<" low score    "<<window_close_second<<" close second    "<<window_hit<<" hits"<<std::endl;
    sdglib::OutputLog()<<"Read results:    "<<no_matches<<" no match    "<<single_matches<<" single match    "<<multi_matches<<" multi matches"<<std::endl;
    for (auto & threadm : thread_mappings) {
        mappings.insert(mappings.end(),threadm.begin(),threadm.end());
    }
    sdglib::OutputLog() << "Updating mapping indexes" <<std::endl;
    update_indexes();
}